

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

NodeRef * __thiscall c4::yml::Tree::ref(NodeRef *__return_storage_ptr__,Tree *this,size_t id)

{
  code *pcVar1;
  Location LVar2;
  bool bVar3;
  NodeRef *pNVar4;
  char msg [53];
  char local_58 [64];
  
  if ((id == 0xffffffffffffffff) || (this->m_size <= id)) {
    builtin_strncpy(local_58,"check failed: (id != NONE && id >= 0 && id < m_size)",0x35);
    if (((byte)s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar1 = (code *)swi(3);
        pNVar4 = (NodeRef *)(*pcVar1)();
        return pNVar4;
      }
    }
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x6258) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x6258) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_58,0x35,LVar2,(this->m_callbacks).m_user_data);
  }
  __return_storage_ptr__->m_tree = this;
  __return_storage_ptr__->m_id = id;
  (__return_storage_ptr__->m_seed).str = (char *)0x0;
  (__return_storage_ptr__->m_seed).len = 0xffffffffffffffff;
  return __return_storage_ptr__;
}

Assistant:

NodeRef Tree::ref(size_t id)
{
    _RYML_CB_ASSERT(m_callbacks, id != NONE && id >= 0 && id < m_size);
    return NodeRef(this, id);
}